

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O1

void __thiscall
miniscript::Node<XOnlyPubKey>::DuplicateKeyCheck<TapSatisfier>
          (Node<XOnlyPubKey> *this,TapSatisfier *ctx)

{
  long in_FS_OFFSET;
  optional<std::set<XOnlyPubKey,_Comp,_std::allocator<XOnlyPubKey>_>_> oStack_48;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  TreeEval<std::optional<std::set<XOnlyPubKey,miniscript::Node<XOnlyPubKey>::DuplicateKeyCheck<TapSatisfier>(TapSatisfier_const&)const::Comp,std::allocator<XOnlyPubKey>>>,miniscript::Node<XOnlyPubKey>::DuplicateKeyCheck<TapSatisfier>(TapSatisfier_const&)const::_lambda(miniscript::Node<XOnlyPubKey>const&,Span<std::optional<std::set<XOnlyPubKey,miniscript::Node<XOnlyPubKey>::DuplicateKeyCheck<TapSatisfier>(auto:1_const&)const::Comp,std::allocator<XOnlyPubKey>>>>)_1_>
            (&oStack_48,this,(anon_class_8_1_ba1d3d87)ctx);
  if (oStack_48.
      super__Optional_base<std::set<XOnlyPubKey,_Comp,_std::allocator<XOnlyPubKey>_>,_false,_false>.
      _M_payload.
      super__Optional_payload<std::set<XOnlyPubKey,_Comp,_std::allocator<XOnlyPubKey>_>,_true,_false,_false>
      .super__Optional_payload_base<std::set<XOnlyPubKey,_Comp,_std::allocator<XOnlyPubKey>_>_>.
      _M_engaged == true) {
    oStack_48.
    super__Optional_base<std::set<XOnlyPubKey,_Comp,_std::allocator<XOnlyPubKey>_>,_false,_false>.
    _M_payload.
    super__Optional_payload<std::set<XOnlyPubKey,_Comp,_std::allocator<XOnlyPubKey>_>,_true,_false,_false>
    .super__Optional_payload_base<std::set<XOnlyPubKey,_Comp,_std::allocator<XOnlyPubKey>_>_>.
    _M_engaged = false;
    std::
    _Rb_tree<XOnlyPubKey,_XOnlyPubKey,_std::_Identity<XOnlyPubKey>,_Comp,_std::allocator<XOnlyPubKey>_>
    ::~_Rb_tree((_Rb_tree<XOnlyPubKey,_XOnlyPubKey,_std::_Identity<XOnlyPubKey>,_Comp,_std::allocator<XOnlyPubKey>_>
                 *)&oStack_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void DuplicateKeyCheck(const Ctx& ctx) const
    {
        // We cannot use a lambda here, as lambdas are non assignable, and the set operations
        // below require moving the comparators around.
        struct Comp {
            const Ctx* ctx_ptr;
            Comp(const Ctx& ctx) : ctx_ptr(&ctx) {}
            bool operator()(const Key& a, const Key& b) const { return ctx_ptr->KeyCompare(a, b); }
        };

        // state in the recursive computation:
        // - std::nullopt means "this node has duplicates"
        // - an std::set means "this node has no duplicate keys, and they are: ...".
        using keyset = std::set<Key, Comp>;
        using state = std::optional<keyset>;

        auto upfn = [&ctx](const Node& node, Span<state> subs) -> state {
            // If this node is already known to have duplicates, nothing left to do.
            if (node.has_duplicate_keys.has_value() && *node.has_duplicate_keys) return {};

            // Check if one of the children is already known to have duplicates.
            for (auto& sub : subs) {
                if (!sub.has_value()) {
                    node.has_duplicate_keys = true;
                    return {};
                }
            }

            // Start building the set of keys involved in this node and children.
            // Start by keys in this node directly.
            size_t keys_count = node.keys.size();
            keyset key_set{node.keys.begin(), node.keys.end(), Comp(ctx)};
            if (key_set.size() != keys_count) {
                // It already has duplicates; bail out.
                node.has_duplicate_keys = true;
                return {};
            }

            // Merge the keys from the children into this set.
            for (auto& sub : subs) {
                keys_count += sub->size();
                // Small optimization: std::set::merge is linear in the size of the second arg but
                // logarithmic in the size of the first.
                if (key_set.size() < sub->size()) std::swap(key_set, *sub);
                key_set.merge(*sub);
                if (key_set.size() != keys_count) {
                    node.has_duplicate_keys = true;
                    return {};
                }
            }

            node.has_duplicate_keys = false;
            return key_set;
        };

        TreeEval<state>(upfn);
    }